

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_temp(tcv_t *tcv,int16_t *temp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ushort uVar6;
  uint8_t scratch [2];
  uint8_t scratch_1 [2];
  byte local_3a;
  byte local_39;
  uint local_38;
  ushort local_32;
  
  iVar5 = -6;
  if (((tcv != (tcv_t *)0x0) && (iVar5 = -6, tcv->data != (void *)0x0)) &&
     (bVar1 = *(byte *)((long)tcv->data + 0x5d), (bVar1 & 0x40) != 0)) {
    if ((bVar1 & 0x20) == 0) {
      if ((bVar1 & 0x10) == 0) {
        return -1;
      }
      iVar4 = (*tcv->read)(tcv->index,'Q','T',&local_3a,2);
      bVar3 = local_39;
      bVar1 = local_3a;
      iVar5 = -1;
      if ((iVar4 < 0) ||
         (iVar4 = (*tcv->read)(tcv->index,'Q','V',&local_3a,2), bVar2 = local_3a, iVar4 < 0)) {
        uVar6 = 0;
      }
      else {
        local_38 = (uint)local_39;
        iVar4 = (*tcv->read)(tcv->index,'Q','`',&local_3a,2);
        uVar6 = 0;
        if (-1 < iVar4) {
          uVar6 = (short)(((int)(short)((ushort)local_3a << 8) | (uint)local_39) *
                          ((int)(short)((ushort)bVar1 << 8) | (uint)bVar3) >> 8) +
                  ((ushort)local_38 | (ushort)bVar2 << 8);
          iVar5 = 0;
        }
      }
    }
    else {
      iVar5 = (*tcv->read)(tcv->index,'Q','`',(uint8_t *)&local_32,2);
      uVar6 = local_32 << 8 | local_32 >> 8;
      if (iVar5 < 0) {
        uVar6 = 0;
      }
      iVar5 = iVar5 >> 0x1f;
    }
    if (iVar5 < 0) {
      iVar5 = -1;
    }
    else {
      *temp = uVar6;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int sfp_get_temp(tcv_t *tcv, int16_t* temp)
{
	int16_t val=0;
	int err = 0;

	en_calibration_type calib;

	calib = sfp_dd_type(tcv);

	switch (calib) {
		case DD_UNAVAILABLE:
			err = TCV_ERR_DIAGNOSTICS_INFO_NOT_PRESENT;
			break;
		case DD_CALIB_INTERNAL:
			err = get_short_ad_val(tcv, DD_TEMP_AD_REG, &val);
			break;
		case DD_CALIB_EXTERNAL:
			err = get_temp_calib_f8(tcv, &val);
			break;
		default:
			err = TCV_ERR_GENERIC;
	}
	if (err < 0)
		return err;

	*temp = (int16_t) val;
	return 0;
}